

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestResourceGroupsLexerHelper.cxx
# Opt level: O2

void __thiscall
cmCTestResourceGroupsLexerHelper::WriteRequirement(cmCTestResourceGroupsLexerHelper *this)

{
  cmCTestTestResourceRequirement local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)&this->ResourceType);
  local_40.SlotsNeeded = this->NeededSlots;
  local_40.UnitsNeeded = 1;
  std::
  vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>
  ::emplace_back<cmCTestTestHandler::cmCTestTestResourceRequirement>(&this->Process,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void cmCTestResourceGroupsLexerHelper::WriteRequirement()
{
  this->Process.push_back({ this->ResourceType, this->NeededSlots, 1 });
}